

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

int __thiscall google::protobuf::UninterpretedOption::ByteSize(UninterpretedOption *this)

{
  string *psVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  if ((this->_has_bits_[0] & 0x1fe) == 0) {
    iVar4 = 0;
  }
  else {
    iVar3 = 0;
    if ((this->_has_bits_[0] & 2) != 0) {
      psVar1 = this->identifier_value_;
      uVar5 = (uint)psVar1->_M_string_length;
      iVar3 = 2;
      if (0x7f < uVar5) {
        iVar3 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
        iVar3 = iVar3 + 1;
      }
      iVar3 = iVar3 + (int)psVar1->_M_string_length;
    }
    if ((this->_has_bits_[0] & 4) != 0) {
      iVar4 = io::CodedOutputStream::VarintSize64(this->positive_int_value_);
      iVar3 = iVar3 + iVar4 + 1;
    }
    if ((this->_has_bits_[0] & 8) != 0) {
      iVar4 = io::CodedOutputStream::VarintSize64(this->negative_int_value_);
      iVar3 = iVar3 + iVar4 + 1;
    }
    iVar4 = iVar3 + 9;
    if ((this->_has_bits_[0] & 0x10) == 0) {
      iVar4 = iVar3;
    }
    if ((this->_has_bits_[0] & 0x20) != 0) {
      psVar1 = this->string_value_;
      uVar5 = (uint)psVar1->_M_string_length;
      iVar3 = 1;
      if (0x7f < uVar5) {
        iVar3 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
      }
      iVar4 = iVar4 + iVar3 + (int)psVar1->_M_string_length + 1;
    }
    if ((this->_has_bits_[0] & 0x40) != 0) {
      psVar1 = this->aggregate_value_;
      uVar5 = (uint)psVar1->_M_string_length;
      iVar3 = 1;
      if (0x7f < uVar5) {
        iVar3 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
      }
      iVar4 = iVar4 + iVar3 + (int)psVar1->_M_string_length + 1;
    }
  }
  iVar3 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar3;
  if (0 < iVar3) {
    lVar6 = 0;
    do {
      uVar5 = UninterpretedOption_NamePart::ByteSize
                        ((UninterpretedOption_NamePart *)
                         (this->name_).super_RepeatedPtrFieldBase.elements_[lVar6]);
      iVar3 = 1;
      if (0x7f < uVar5) {
        iVar3 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
      }
      iVar4 = iVar4 + uVar5 + iVar3;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->name_).super_RepeatedPtrFieldBase.current_size_);
  }
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar3 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar4 = iVar3 + iVar4;
  }
  this->_cached_size_ = iVar4;
  return iVar4;
}

Assistant:

int UninterpretedOption::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[1 / 32] & (0xffu << (1 % 32))) {
    // optional string identifier_value = 3;
    if (has_identifier_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->identifier_value());
    }

    // optional uint64 positive_int_value = 4;
    if (has_positive_int_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt64Size(
          this->positive_int_value());
    }

    // optional int64 negative_int_value = 5;
    if (has_negative_int_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->negative_int_value());
    }

    // optional double double_value = 6;
    if (has_double_value()) {
      total_size += 1 + 8;
    }

    // optional bytes string_value = 7;
    if (has_string_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::BytesSize(
          this->string_value());
    }

    // optional string aggregate_value = 8;
    if (has_aggregate_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->aggregate_value());
    }

  }
  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  total_size += 1 * this->name_size();
  for (int i = 0; i < this->name_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->name(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}